

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeBinaryOp(ExpressionContext *ctx,SynBinaryOp *syntax)

{
  ExprBase *pEVar1;
  SynBinaryOp *ctx_00;
  SynBinaryOp *ctx_01;
  bool bVar2;
  char *strBegin;
  ExprBase *pEVar3;
  ExprBase *pEVar4;
  ExpressionContext *this;
  TypeBase *pTVar5;
  InplaceStr functionName;
  ExprBase *rhs;
  InplaceStr local_40;
  undefined8 local_30;
  ExprBase *result;
  ExprBase *lhs;
  SynBinaryOp *syntax_local;
  ExpressionContext *ctx_local;
  
  lhs = (ExprBase *)syntax;
  syntax_local = (SynBinaryOp *)ctx;
  result = AnalyzeExpression(ctx,syntax->lhs);
  if (((*(int *)&lhs[1].field_0xc == 0x12) || (*(int *)&lhs[1].field_0xc == 0x13)) &&
     (bVar2 = isType<TypeClass>(result->type), ctx_00 = syntax_local, pEVar4 = lhs, bVar2)) {
    strBegin = GetOpName(*(SynBinaryOpType *)&lhs[1].field_0xc);
    InplaceStr::InplaceStr(&local_40,strBegin);
    ctx_01 = syntax_local;
    pEVar3 = lhs;
    pEVar1 = result;
    pTVar5 = lhs[1].type;
    functionName = GetTemporaryFunctionName((ExpressionContext *)syntax_local);
    pEVar3 = CreateValueFunctionWrapper
                       ((ExpressionContext *)ctx_01,(SynBase *)pEVar3,(SynBase *)pTVar5,
                        (ExprBase *)0x0,functionName);
    pEVar4 = CreateFunctionCall2((ExpressionContext *)ctx_00,(SynBase *)pEVar4,local_40,pEVar1,
                                 pEVar3,true,false,true);
    if (pEVar4 != (ExprBase *)0x0) {
      return pEVar4;
    }
    local_30 = 0;
  }
  pEVar4 = AnalyzeExpression((ExpressionContext *)syntax_local,(SynBase *)lhs[1].type);
  bVar2 = isType<TypeError>(result->type);
  if ((bVar2) || (bVar2 = isType<TypeError>(pEVar4->type), bVar2)) {
    this = (ExpressionContext *)
           ExpressionContext::get<ExprBinaryOp>((ExpressionContext *)syntax_local);
    pEVar1 = lhs;
    pTVar5 = &ExpressionContext::GetErrorType((ExpressionContext *)syntax_local)->super_TypeBase;
    ExprBinaryOp::ExprBinaryOp
              ((ExprBinaryOp *)this,(SynBase *)pEVar1,pTVar5,*(SynBinaryOpType *)&lhs[1].field_0xc,
               result,pEVar4);
    ctx_local = this;
  }
  else {
    ctx_local = (ExpressionContext *)
                CreateBinaryOp((ExpressionContext *)syntax_local,(SynBase *)lhs,
                               *(SynBinaryOpType *)&lhs[1].field_0xc,result,pEVar4);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeBinaryOp(ExpressionContext &ctx, SynBinaryOp *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);

	// For && and || try to find a function that accepts a wrapped right-hand-side evaluation
	if((syntax->type == SYN_BINARY_OP_LOGICAL_AND || syntax->type == SYN_BINARY_OP_LOGICAL_OR) && isType<TypeClass>(lhs->type))
	{
		if(ExprBase *result = CreateFunctionCall2(ctx, syntax, InplaceStr(GetOpName(syntax->type)), lhs, CreateValueFunctionWrapper(ctx, syntax, syntax->rhs, NULL, GetTemporaryFunctionName(ctx)), true, false, true))
			return result;
	}

	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(syntax, ctx.GetErrorType(), syntax->type, lhs, rhs);

	return CreateBinaryOp(ctx, syntax, syntax->type, lhs, rhs);
}